

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uname.cpp
# Opt level: O2

string * fs_os_version_abi_cxx11_(void)

{
  int iVar1;
  string *in_RDI;
  utsname buf;
  allocator<char> local_18f;
  utsname local_18e;
  
  iVar1 = uname(&local_18e);
  if (iVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,local_18e.version,&local_18f);
  }
  else {
    fs_print_error("","fs_os_version");
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    in_RDI->_M_string_length = 0;
    (in_RDI->field_2)._M_local_buf[0] = '\0';
  }
  return in_RDI;
}

Assistant:

std::string fs_os_version()
{
// get operating system version
#ifdef HAVE_UTSNAME
  if (struct utsname buf; uname(&buf) == 0)
    return buf.version;
#elif defined(_WIN32)
  OSVERSIONINFOA osvi;
  ZeroMemory(&osvi, sizeof(OSVERSIONINFOA));
  osvi.dwOSVersionInfoSize = sizeof(OSVERSIONINFOA);
  if(GetVersionExA(&osvi))
    return std::to_string(osvi.dwMajorVersion) + '.' + std::to_string(osvi.dwMinorVersion) + '.' + std::to_string(osvi.dwBuildNumber);
#endif

  fs_print_error("", __func__);
  return {};
}